

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O2

SRes LzmaDec_Allocate(CLzmaDec *p,Byte *props,uint propsSize,ISzAllocPtr alloc)

{
  CLzmaProps CVar1;
  SRes SVar2;
  ulong uVar3;
  Byte *pBVar4;
  ulong uVar5;
  ulong uVar6;
  CLzmaProps propNew;
  
  SVar2 = LzmaProps_Decode(&propNew,props,propsSize);
  if ((SVar2 == 0) && (SVar2 = LzmaDec_AllocateProbs2(p,&propNew,alloc), SVar2 == 0)) {
    uVar3 = (ulong)propNew.dicSize;
    uVar5 = 0xfff;
    if (0x3fffff < uVar3) {
      uVar5 = 0xfffff;
    }
    uVar6 = 0x3fffff;
    if (uVar3 < 0x40000000) {
      uVar6 = uVar5;
    }
    uVar5 = ~uVar6 & uVar6 + uVar3;
    if (uVar5 <= uVar3) {
      uVar5 = uVar3;
    }
    if ((p->dic == (Byte *)0x0) || (uVar5 != p->dicBufSize)) {
      (*alloc->Free)(alloc,p->dic);
      p->dic = (Byte *)0x0;
      pBVar4 = (Byte *)(*alloc->Alloc)(alloc,uVar5);
      p->dic = pBVar4;
      if (pBVar4 == (Byte *)0x0) {
        (*alloc->Free)(alloc,p->probs);
        p->probs = (CLzmaProb *)0x0;
        return 2;
      }
    }
    p->dicBufSize = uVar5;
    CVar1.dicSize = propNew.dicSize;
    CVar1.lc = propNew.lc;
    CVar1.lp = propNew.lp;
    CVar1.pb = propNew.pb;
    CVar1._pad_ = propNew._pad_;
    p->prop = CVar1;
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

SRes LzmaDec_Allocate(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAllocPtr alloc)
{
  CLzmaProps propNew;
  SizeT dicBufSize;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize))
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc))

  {
    UInt32 dictSize = propNew.dicSize;
    SizeT mask = ((UInt32)1 << 12) - 1;
         if (dictSize >= ((UInt32)1 << 30)) mask = ((UInt32)1 << 22) - 1;
    else if (dictSize >= ((UInt32)1 << 22)) mask = ((UInt32)1 << 20) - 1;
    dicBufSize = ((SizeT)dictSize + mask) & ~mask;
    if (dicBufSize < dictSize)
      dicBufSize = dictSize;
  }

  if (!p->dic || dicBufSize != p->dicBufSize)
  {
    LzmaDec_FreeDict(p, alloc);
    p->dic = (Byte *)ISzAlloc_Alloc(alloc, dicBufSize);
    if (!p->dic)
    {
      LzmaDec_FreeProbs(p, alloc);
      return SZ_ERROR_MEM;
    }
  }
  p->dicBufSize = dicBufSize;
  p->prop = propNew;
  return SZ_OK;
}